

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O2

void cm_zlib_inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte *pbVar2;
  Bytef *pBVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  internal_state *piVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  Bytef *pBVar16;
  int iVar17;
  long lVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  Bytef *pBVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  Bytef *pBVar27;
  long lVar28;
  Bytef *pBVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  int local_48;
  
  piVar9 = strm->state;
  pBVar29 = strm->next_in + ((ulong)(strm->avail_in - 5) - 1);
  pBVar22 = strm->next_in + -1;
  pBVar27 = strm->next_out + -1;
  local_48 = (int)pBVar27 - (start - strm->avail_out);
  pBVar16 = strm->next_out + ((ulong)(strm->avail_out - 0x101) - 1);
  iVar17 = piVar9[0xd].dummy;
  uVar7 = piVar9[0xe].dummy;
  uVar8 = piVar9[0xf].dummy;
  lVar23 = *(long *)(piVar9 + 0x10);
  iVar12 = piVar9[0x1c].dummy;
  uVar25 = *(ulong *)(piVar9 + 0x12);
  iVar13 = piVar9[0x1d].dummy;
  uVar14 = piVar9[0x14].dummy;
  lVar10 = *(long *)(piVar9 + 0x18);
  lVar11 = *(long *)(piVar9 + 0x1a);
LAB_0042cb70:
  if (uVar14 < 0xf) {
    pbVar1 = pBVar22 + 1;
    pbVar2 = pBVar22 + 2;
    pBVar22 = pBVar22 + 2;
    uVar25 = ((ulong)*pbVar2 << ((byte)uVar14 + 8 & 0x3f)) +
             ((ulong)*pbVar1 << ((byte)uVar14 & 0x3f)) + uVar25;
    uVar14 = uVar14 | 0x10;
  }
  uVar24 = (ulong)((uint)uVar25 & ~(-1 << ((byte)iVar12 & 0x1f)));
  while( true ) {
    bVar4 = *(byte *)(lVar10 + 1 + uVar24 * 4);
    uVar25 = uVar25 >> (bVar4 & 0x3f);
    bVar5 = *(byte *)(lVar10 + uVar24 * 4);
    uVar14 = uVar14 - bVar4;
    uVar6 = *(ushort *)(lVar10 + 2 + uVar24 * 4);
    uVar24 = (ulong)uVar6;
    if (bVar5 == 0) break;
    if ((bVar5 & 0x10) != 0) {
      uVar20 = bVar5 & 0xf;
      if ((bVar5 & 0xf) != 0) {
        if (uVar14 < uVar20) {
          pbVar1 = pBVar22 + 1;
          pBVar22 = pBVar22 + 1;
          uVar25 = uVar25 + ((ulong)*pbVar1 << ((byte)uVar14 & 0x3f));
          uVar14 = uVar14 + 8;
        }
        uVar15 = (uint)uVar25;
        uVar25 = uVar25 >> (sbyte)uVar20;
        uVar14 = uVar14 - uVar20;
        uVar24 = (ulong)((~(-1 << (sbyte)uVar20) & uVar15) + (uint)uVar6);
      }
      if (uVar14 < 0xf) {
        pbVar1 = pBVar22 + 1;
        pbVar2 = pBVar22 + 2;
        pBVar22 = pBVar22 + 2;
        uVar25 = ((ulong)*pbVar2 << ((byte)uVar14 + 8 & 0x3f)) +
                 ((ulong)*pbVar1 << ((byte)uVar14 & 0x3f)) + uVar25;
        uVar14 = uVar14 | 0x10;
      }
      uVar30 = (ulong)((uint)uVar25 & ~(-1 << ((byte)iVar13 & 0x1f)));
      goto LAB_0042cc54;
    }
    if ((bVar5 & 0x40) != 0) {
      if ((bVar5 & 0x20) != 0) {
        iVar17 = 0xb;
        goto LAB_0042cf67;
      }
      pcVar19 = "invalid literal/length code";
      goto LAB_0042cf57;
    }
    uVar24 = (~(-1 << (bVar5 & 0x1f)) & (uint)uVar25) + uVar24;
  }
  pBVar27[1] = (Bytef)uVar6;
  pBVar27 = pBVar27 + 1;
  goto LAB_0042cf04;
LAB_0042cc54:
  bVar4 = *(byte *)(lVar11 + 1 + uVar30 * 4);
  uVar25 = uVar25 >> (bVar4 & 0x3f);
  bVar5 = *(byte *)(lVar11 + uVar30 * 4);
  uVar6 = *(ushort *)(lVar11 + 2 + uVar30 * 4);
  uVar14 = uVar14 - bVar4;
  if ((bVar5 & 0x10) != 0) goto LAB_0042cc8f;
  if ((bVar5 & 0x40) != 0) {
    pcVar19 = "invalid distance code";
    goto LAB_0042cf57;
  }
  uVar30 = (ulong)(~(-1 << (bVar5 & 0x1f)) & (uint)uVar25) + (ulong)uVar6;
  goto LAB_0042cc54;
LAB_0042cc8f:
  uVar20 = bVar5 & 0xf;
  if (uVar14 < uVar20) {
    uVar25 = ((ulong)pBVar22[1] << ((byte)uVar14 & 0x3f)) + uVar25;
    uVar15 = uVar14 + 8;
    if (uVar15 < uVar20) {
      pbVar1 = pBVar22 + 2;
      pBVar22 = pBVar22 + 2;
      uVar25 = uVar25 + ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f));
      uVar14 = uVar14 + 0x10;
    }
    else {
      pBVar22 = pBVar22 + 1;
      uVar14 = uVar15;
    }
  }
  uVar31 = (~(-1 << (sbyte)uVar20) & (uint)uVar25) + (uint)uVar6;
  uVar25 = uVar25 >> (sbyte)uVar20;
  uVar14 = uVar14 - uVar20;
  uVar20 = (int)pBVar27 - local_48;
  uVar30 = (ulong)uVar31;
  uVar32 = uVar31 - uVar20;
  uVar15 = (uint)uVar24;
  if (uVar31 < uVar20 || uVar32 == 0) {
    lVar28 = 0;
    do {
      lVar18 = lVar28;
      pBVar27[lVar18 + 1] = pBVar27[lVar18 + (1 - uVar30)];
      pBVar27[lVar18 + 2] = pBVar27[lVar18 + (2 - uVar30)];
      pBVar27[lVar18 + 3] = pBVar27[lVar18 + (3 - uVar30)];
      uVar20 = (int)uVar24 - 3;
      uVar24 = (ulong)uVar20;
      lVar28 = lVar18 + 3;
    } while (2 < uVar20);
    if ((uint)lVar28 == uVar15) {
      pBVar27 = pBVar27 + lVar28;
    }
    else {
      pBVar27[lVar18 + 4] = pBVar27[-uVar30 + 1 + lVar28];
      if ((uint)lVar28 - uVar15 == -2) {
        pBVar3 = pBVar27 + -uVar30 + 2 + lVar28;
        pBVar27 = pBVar27 + lVar18 + 5;
        *pBVar27 = *pBVar3;
      }
      else {
        pBVar27 = pBVar27 + lVar18 + 4;
      }
    }
    goto LAB_0042cf04;
  }
  if (uVar7 < uVar32) {
    pcVar19 = "invalid distance too far back";
LAB_0042cf57:
    strm->msg = pcVar19;
    iVar17 = 0x1b;
LAB_0042cf67:
    piVar9->dummy = iVar17;
LAB_0042cf6a:
    lVar23 = (long)pBVar22 - (ulong)(uVar14 >> 3);
    strm->next_in = (Bytef *)(lVar23 + 1);
    strm->next_out = pBVar27 + 1;
    strm->avail_in = ((int)pBVar29 - (int)lVar23) + 5;
    strm->avail_out = ((int)pBVar16 - (int)pBVar27) + 0x101;
    *(ulong *)(piVar9 + 0x12) = (ulong)((uint)uVar25 & ~(-1 << (sbyte)(uVar14 & 7)));
    piVar9[0x14].dummy = uVar14 & 7;
    return;
  }
  if (uVar8 == 0) {
    uVar21 = (ulong)(iVar17 - uVar32);
    uVar20 = uVar15 - uVar32;
    if (uVar15 < uVar32 || uVar20 == 0) goto LAB_0042ce83;
    lVar28 = 0;
    do {
      pBVar27[1] = *(Bytef *)(uVar21 + lVar23 + lVar28);
      pBVar27 = pBVar27 + 1;
      lVar28 = lVar28 + 1;
    } while (uVar32 != (uint)lVar28);
LAB_0042ce78:
    lVar28 = (long)pBVar27 - uVar30;
    uVar24 = (ulong)uVar20;
  }
  else {
    if (uVar8 < uVar32) {
      uVar21 = (ulong)((uVar8 + iVar17) - uVar32);
      uVar32 = uVar32 - uVar8;
      uVar20 = uVar15 - uVar32;
      if (uVar32 <= uVar15 && uVar20 != 0) {
        lVar28 = 0;
        do {
          pBVar27[lVar28 + 1] = *(Bytef *)(uVar21 + lVar23 + lVar28);
          lVar28 = lVar28 + 1;
        } while (uVar32 != (uint)lVar28);
        pBVar27 = pBVar27 + lVar28;
        if (uVar8 < uVar20) {
          lVar28 = 0;
          do {
            pBVar27[1] = *(Bytef *)(lVar23 + lVar28);
            pBVar27 = pBVar27 + 1;
            lVar28 = lVar28 + 1;
          } while (uVar8 != (uint)lVar28);
          uVar24 = (ulong)(uVar20 - uVar8);
          lVar28 = (long)pBVar27 - uVar30;
        }
        else {
          uVar24 = (ulong)uVar20;
          lVar28 = lVar23 + -1;
        }
        goto LAB_0042ce8d;
      }
    }
    else {
      uVar21 = (ulong)(uVar8 - uVar32);
      uVar20 = uVar15 - uVar32;
      if (uVar32 <= uVar15 && uVar20 != 0) {
        lVar28 = 0;
        do {
          pBVar27[1] = *(Bytef *)(uVar21 + lVar23 + lVar28);
          pBVar27 = pBVar27 + 1;
          lVar28 = lVar28 + 1;
        } while (uVar32 != (uint)lVar28);
        goto LAB_0042ce78;
      }
    }
LAB_0042ce83:
    lVar28 = uVar21 + lVar23 + -1;
  }
LAB_0042ce8d:
  lVar18 = 0;
  iVar26 = (int)uVar24;
  for (; 2 < (uint)uVar24; uVar24 = (ulong)((uint)uVar24 - 3)) {
    pBVar27[lVar18 + 1] = *(Bytef *)(lVar28 + 1 + lVar18);
    pBVar27[lVar18 + 2] = *(Bytef *)(lVar28 + 2 + lVar18);
    pBVar27[lVar18 + 3] = *(Bytef *)(lVar28 + 3 + lVar18);
    lVar18 = lVar18 + 3;
  }
  if ((int)lVar18 == iVar26) {
    pBVar27 = pBVar27 + lVar18;
  }
  else {
    pBVar27[lVar18 + 1] = *(Bytef *)(lVar28 + 1 + lVar18);
    if ((int)lVar18 - iVar26 == -2) {
      pBVar27 = pBVar27 + lVar18 + 2;
      *pBVar27 = *(Bytef *)(lVar28 + 2 + lVar18);
    }
    else {
      pBVar27 = pBVar27 + lVar18 + 1;
    }
  }
LAB_0042cf04:
  if ((pBVar29 <= pBVar22) || (pBVar16 <= pBVar27)) goto LAB_0042cf6a;
  goto LAB_0042cb70;
}

Assistant:

void inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned write;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code this;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    write = state->write;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
        }
        this = lcode[hold & lmask];
      dolen:
        op = (unsigned)(this.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(this.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, this.val >= 0x20 && this.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", this.val));
            PUP(out) = (unsigned char)(this.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(this.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
            }
            this = dcode[hold & dmask];
          dodist:
            op = (unsigned)(this.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(this.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(this.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        strm->msg = (char *)"invalid distance too far back";
                        state->mode = BAD;
                        break;
                    }
                    from = window - OFF;
                    if (write == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (write < op) {      /* wrap around window */
                        from += wsize + write - op;
                        op -= write;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (write < len) {  /* some from start of window */
                                op = write;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += write - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                this = dcode[this.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            this = lcode[this.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}